

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O0

FileOpenFlags __thiscall
duckdb::SingleFileBlockManager::GetFileFlags(SingleFileBlockManager *this,bool create_new)

{
  FileOpenFlags b;
  FileOpenFlags b_00;
  FileOpenFlags b_01;
  FileOpenFlags b_02;
  FileOpenFlags b_03;
  FileOpenFlags b_04;
  FileOpenFlags FVar1;
  byte in_SIL;
  FileOpenFlags *in_RDI;
  FileOpenFlags FVar2;
  FileOpenFlags result;
  idx_t in_stack_fffffffffffffee8;
  FileOpenFlags *in_stack_fffffffffffffef0;
  idx_t in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  idx_t local_e8;
  FileLockType local_e0;
  FileCompressionType FStack_df;
  FileOpenFlags local_d8;
  FileOpenFlags local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  idx_t local_a8;
  undefined2 local_a0;
  idx_t local_98;
  FileLockType local_90;
  FileCompressionType FStack_8f;
  FileOpenFlags local_88;
  FileOpenFlags local_78;
  FileOpenFlags local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  idx_t local_40;
  undefined2 local_38;
  idx_t local_30;
  FileLockType local_28;
  FileCompressionType FStack_27;
  byte local_19;
  FileOpenFlags local_10;
  
  local_19 = in_SIL & 1;
  FileOpenFlags::FileOpenFlags(&local_10);
  if ((in_RDI[0x1e].lock & READ_LOCK) == NO_LOCK) {
    local_b8 = 1;
    uStack_b0 = 0x100;
    FVar2.lock = (char)in_stack_ffffffffffffff00;
    FVar2.compression = (char)((ulong)in_stack_ffffffffffffff00 >> 8);
    FVar2._10_6_ = (int6)((ulong)in_stack_ffffffffffffff00 >> 0x10);
    FVar2.flags = in_stack_fffffffffffffef8;
    FVar2 = FileOpenFlags::operator|(in_stack_fffffffffffffef0,FVar2);
    local_c8._8_2_ = FVar2._8_2_;
    local_a0._0_1_ = local_c8.lock;
    local_a0._1_1_ = local_c8.compression;
    local_c8.flags = FVar2.flags;
    local_a8 = local_c8.flags;
    local_c8 = FVar2;
    FileOpenFlags::FileOpenFlags(&local_d8,WRITE_LOCK);
    b_04.lock = (char)in_stack_ffffffffffffff00;
    b_04.compression = (char)((ulong)in_stack_ffffffffffffff00 >> 8);
    b_04._10_6_ = (int6)((ulong)in_stack_ffffffffffffff00 >> 0x10);
    b_04.flags = in_stack_fffffffffffffef8;
    FVar2 = FileOpenFlags::operator|(in_stack_fffffffffffffef0,b_04);
    local_e8 = FVar2.flags;
    local_98 = local_e8;
    _local_e0 = FVar2._8_2_;
    local_90 = local_e0;
    FStack_8f = FStack_df;
    local_10.flags = local_e8;
    local_10.lock = local_e0;
    local_10.compression = FStack_df;
    if ((local_19 & 1) != 0) {
      b._8_8_ = in_stack_fffffffffffffef0;
      b.flags = in_stack_fffffffffffffee8;
      FileOpenFlags::operator|=(in_RDI,b);
    }
  }
  else {
    local_58 = 0x80;
    uStack_50 = 0x100;
    b_02.lock = (char)in_stack_ffffffffffffff00;
    b_02.compression = (char)((ulong)in_stack_ffffffffffffff00 >> 8);
    b_02._10_6_ = (int6)((ulong)in_stack_ffffffffffffff00 >> 0x10);
    b_02.flags = in_stack_fffffffffffffef8;
    FVar2 = FileOpenFlags::operator|(in_stack_fffffffffffffef0,b_02);
    local_68._8_2_ = FVar2._8_2_;
    local_38._0_1_ = local_68.lock;
    local_38._1_1_ = local_68.compression;
    local_68.flags = FVar2.flags;
    local_40 = local_68.flags;
    local_68 = FVar2;
    FileOpenFlags::FileOpenFlags(&local_78,READ_LOCK);
    b_03.lock = (char)in_stack_ffffffffffffff00;
    b_03.compression = (char)((ulong)in_stack_ffffffffffffff00 >> 8);
    b_03._10_6_ = (int6)((ulong)in_stack_ffffffffffffff00 >> 0x10);
    b_03.flags = in_stack_fffffffffffffef8;
    FVar2 = FileOpenFlags::operator|(in_stack_fffffffffffffef0,b_03);
    local_88.flags = FVar2.flags;
    local_30 = local_88.flags;
    local_88._8_2_ = FVar2._8_2_;
    local_28 = local_88.lock;
    FStack_27 = local_88.compression;
    local_10.flags = local_88.flags;
    local_10.lock = local_88.lock;
    local_10.compression = local_88.compression;
    local_88 = FVar2;
  }
  if ((in_RDI[0x1e].compression & UNCOMPRESSED) != AUTO_DETECT) {
    b_00._8_8_ = in_stack_fffffffffffffef0;
    b_00.flags = in_stack_fffffffffffffee8;
    FileOpenFlags::operator|=(in_RDI,b_00);
  }
  b_01.lock = NO_LOCK;
  b_01.compression = UNCOMPRESSED;
  b_01._10_6_ = 0;
  b_01.flags = 0x100;
  FileOpenFlags::operator|=(in_RDI,b_01);
  FVar1.lock = local_10.lock;
  FVar1.compression = local_10.compression;
  FVar1.flags = local_10.flags;
  FVar1._10_6_ = local_10._10_6_;
  return FVar1;
}

Assistant:

FileOpenFlags SingleFileBlockManager::GetFileFlags(bool create_new) const {
	FileOpenFlags result;
	if (options.read_only) {
		D_ASSERT(!create_new);
		result = FileFlags::FILE_FLAGS_READ | FileFlags::FILE_FLAGS_NULL_IF_NOT_EXISTS | FileLockType::READ_LOCK;
	} else {
		result = FileFlags::FILE_FLAGS_WRITE | FileFlags::FILE_FLAGS_READ | FileLockType::WRITE_LOCK;
		if (create_new) {
			result |= FileFlags::FILE_FLAGS_FILE_CREATE;
		}
	}
	if (options.use_direct_io) {
		result |= FileFlags::FILE_FLAGS_DIRECT_IO;
	}
	// database files can be read from in parallel
	result |= FileFlags::FILE_FLAGS_PARALLEL_ACCESS;
	return result;
}